

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

void tcu::computePixelScaleBias(ConstPixelBufferAccess *access,Vec4 *scale,Vec4 *bias)

{
  float fVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  Vec4 maxVal;
  Vec4 minVal;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  
  Vector<float,_4>::Vector(&local_38);
  Vector<float,_4>::Vector(&local_48);
  estimatePixelValueRange(access,&local_38,&local_48);
  lVar2 = 0;
  do {
    if (lVar2 == 0x10) {
      return;
    }
    fVar3 = *(float *)((long)local_48.m_data + lVar2);
    fVar1 = *(float *)((long)local_38.m_data + lVar2);
    fVar4 = fVar3 - fVar1;
    if (0.0001 <= fVar4) {
      fVar4 = 1.0 / fVar4;
      *(float *)((long)scale->m_data + lVar2) = fVar4;
LAB_01612888:
      fVar3 = 0.0 - fVar1 * fVar4;
    }
    else {
      fVar4 = (float)(~-(uint)(fVar3 < 0.0001) & (uint)(1.0 / fVar3) |
                     -(uint)(fVar3 < 0.0001) & 0x3f800000);
      *(float *)((long)scale->m_data + lVar2) = fVar4;
      if (lVar2 != 0xc) goto LAB_01612888;
      fVar3 = scale->m_data[3] * -local_48.m_data[3] + 1.0;
    }
    *(float *)((long)bias->m_data + lVar2) = fVar3;
    lVar2 = lVar2 + 4;
  } while( true );
}

Assistant:

void computePixelScaleBias (const ConstPixelBufferAccess& access, Vec4& scale, Vec4& bias)
{
	Vec4 minVal, maxVal;
	estimatePixelValueRange(access, minVal, maxVal);

	const float eps = 0.0001f;

	for (int c = 0; c < 4; c++)
	{
		if (maxVal[c] - minVal[c] < eps)
		{
			scale[c]	= (maxVal[c] < eps) ? 1.0f : (1.0f / maxVal[c]);
			bias[c]		= (c == 3) ? (1.0f - maxVal[c]*scale[c]) : (0.0f - minVal[c]*scale[c]);
		}
		else
		{
			scale[c]	= 1.0f / (maxVal[c] - minVal[c]);
			bias[c]		= 0.0f - minVal[c]*scale[c];
		}
	}
}